

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O0

TimeProcessingResult __thiscall
helics::ForwardingTimeCoordinator::processTimeMessage
          (ForwardingTimeCoordinator *this,ActionMessage *cmd)

{
  TimeProcessingResult TVar1;
  long in_RDI;
  TimeProcessingResult res;
  ActionMessage *in_stack_000000d8;
  BaseTimeCoordinator *in_stack_000000e0;
  
  TVar1 = BaseTimeCoordinator::processTimeMessage(in_stack_000000e0,in_stack_000000d8);
  if (TVar1 == PROCESSED_NEW_REQUEST) {
    *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) + 100;
    if (16000 < *(int *)(in_RDI + 0x10c)) {
      *(undefined4 *)(in_RDI + 0x10c) = 100;
    }
    *(int *)(in_RDI + 0x4c) = *(int *)(in_RDI + 0x94) + *(int *)(in_RDI + 0x10c);
  }
  return TVar1;
}

Assistant:

TimeProcessingResult ForwardingTimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    auto res = BaseTimeCoordinator::processTimeMessage(cmd);
    if (res == TimeProcessingResult::PROCESSED_NEW_REQUEST) {
        sequenceModifier += mSequenceIncrement;
        if (sequenceModifier > 16000) {
            sequenceModifier = mSequenceIncrement;
        }
        sequenceCounter = upstream.sequenceCounter + sequenceModifier;
    }
    return res;
}